

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::js::api::json::GetPrivkeyFromExtkeyRequest::GetPrivkeyFromExtkeyRequest
          (GetPrivkeyFromExtkeyRequest *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_JsonClassBase<cfd::js::api::json::GetPrivkeyFromExtkeyRequest>)._vptr_JsonClassBase =
       (_func_int **)&PTR__GetPrivkeyFromExtkeyRequest_00a7b740;
  p_Var1 = &(this->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->extkey_)._M_dataplus._M_p = (pointer)&(this->extkey_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->extkey_,"");
  (this->network_)._M_dataplus._M_p = (pointer)&(this->network_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->network_,"mainnet","");
  this->wif_ = true;
  this->is_compressed_ = true;
  CollectFieldName();
  return;
}

Assistant:

GetPrivkeyFromExtkeyRequest() {
    CollectFieldName();
  }